

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printSolutionStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Rational *in_stack_00000058;
  Rational *in_stack_00000060;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000068;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_1;
  Rational sumviol;
  Rational maxviol;
  fmtflags in_stack_fffffffffffffc2c;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc30;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc38;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc68;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd48;
  undefined1 local_2a8 [56];
  undefined1 local_270 [24];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffda8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdb8;
  string local_238 [16];
  Rational *in_stack_fffffffffffffdd8;
  Rational *in_stack_fffffffffffffde0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde8;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [16];
  Rational *in_stack_fffffffffffffe58;
  Rational *in_stack_fffffffffffffe60;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe68;
  string local_178 [32];
  string local_158 [32];
  undefined1 local_138 [64];
  undefined1 local_f8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8 [2];
  ostream *local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_30 = in_RSI;
  SPxOut::setScientific((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  if (in_RDI->_lastSolveMode == 0) {
    poVar3 = std::operator<<(local_30,"Solution (real)     : \n");
    in_stack_fffffffffffffd48 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)std::operator<<(poVar3,"  Objective value   : ");
    objValueReal(in_stack_fffffffffffffc68);
    poVar3 = boost::multiprecision::operator<<
                       (in_stack_fffffffffffffcc0,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)in_stack_fffffffffffffcb8);
    std::operator<<(poVar3,"\n");
  }
  else if (in_RDI->_lastSolveMode == 2) {
    poVar3 = std::operator<<(local_30,"Solution (rational) : \n");
    std::operator<<(poVar3,"  Objective value   : ");
    in_stack_fffffffffffffd38 = local_a8;
    objValueRational(in_stack_fffffffffffffc38);
    in_stack_fffffffffffffd40 =
         boost::multiprecision::operator<<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::operator<<(in_stack_fffffffffffffd40,"\n");
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x49ca92);
    poVar3 = std::operator<<(local_30,"Size (base 2/10)    : \n");
    poVar3 = std::operator<<(poVar3,"  Total primal      : ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  Total dual        : ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM primal       : ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM dual         : ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX primal       : ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX dual         : ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
  }
  else {
    poVar3 = std::operator<<(local_30,"Solution            : \n");
    std::operator<<(poVar3,"  Objective value   : -\n");
  }
  iVar2 = intParam(in_RDI,CHECKMODE);
  if ((iVar2 == 2) ||
     ((iVar2 = intParam(in_RDI,CHECKMODE), iVar2 == 1 &&
      (iVar2 = intParam(in_RDI,READMODE), iVar2 == 1)))) {
    local_20 = local_f8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x49ce57);
    local_18 = local_138;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x49ce74);
    std::operator<<(local_30,"Violation (rational): \n");
    bVar1 = getBoundViolationRational
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_30,"  Max/sum bound     : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_158);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_178);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_158);
    }
    else {
      std::operator<<(local_30,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolationRational
                      (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_30,"  Max/sum row       : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffe68);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_1b8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
    }
    else {
      std::operator<<(local_30,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolationRational
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_30,"  Max/sum redcost   : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_1d8);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_1f8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_1d8);
    }
    else {
      std::operator<<(local_30,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolationRational(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (bVar1) {
      poVar3 = std::operator<<(local_30,"  Max/sum dual      : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffc38,(streamsize)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffde8);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)poVar3,(streamsize)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      poVar3 = std::operator<<(poVar3,local_238);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
    }
    else {
      std::operator<<(local_30,"  Max/sum dual      : - / -\n");
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x49d457);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x49d464);
  }
  else {
    local_10 = local_270;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffc30);
    local_8 = local_2a8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffc30);
    std::operator<<(local_30,"Violations (real)   : \n");
    bVar1 = getBoundViolation(in_stack_fffffffffffffd48,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    if (bVar1) {
      std::operator<<(local_30,"  Max/sum bound     : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_30,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolation(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                            in_stack_fffffffffffffda8);
    if (bVar1) {
      std::operator<<(local_30,"  Max/sum row       : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_30,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolation(in_stack_fffffffffffffde8,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_fffffffffffffde0,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_fffffffffffffdd8);
    if (bVar1) {
      std::operator<<(local_30,"  Max/sum redcost   : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_30,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolation(in_stack_fffffffffffffde8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffde0,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffdd8);
    if (bVar1) {
      std::operator<<(local_30,"  Max/sum dual      : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffcc0,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffcb8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_30,"  Max/sum dual      : - / -\n");
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::printSolutionStatistics(std::ostream& os)
{
   SPxOut::setScientific(os);

   if(_lastSolveMode == SOLVEMODE_REAL)
   {
      os << "Solution (real)     : \n"
         << "  Objective value   : " << objValueReal() << "\n";
   }
   else if(_lastSolveMode == SOLVEMODE_RATIONAL)
   {
      os << "Solution (rational) : \n"
         << "  Objective value   : " << objValueRational() << "\n";
      os << "Size (base 2/10)    : \n"
         << "  Total primal      : " << totalSizePrimalRational() << " / " << totalSizePrimalRational(
            10) << "\n"
         << "  Total dual        : " << totalSizeDualRational() << " / " << totalSizeDualRational(10) << "\n"
         << "  DLCM primal       : " << dlcmSizePrimalRational() << " / " << dlcmSizePrimalRational(
            10) << "\n"
         << "  DLCM dual         : " << dlcmSizeDualRational() << " / " << dlcmSizeDualRational(10) << "\n"
         << "  DMAX primal       : " << dmaxSizePrimalRational() << " / " << dmaxSizePrimalRational(
            10) << "\n"
         << "  DMAX dual         : " << dmaxSizeDualRational() << " / " << dmaxSizeDualRational(10) << "\n";
   }
   else
   {
      os << "Solution            : \n"
         << "  Objective value   : -\n";
   }

   if(intParam(CHECKMODE) == CHECKMODE_RATIONAL
         || (intParam(CHECKMODE) == CHECKMODE_AUTO && intParam(READMODE) == READMODE_RATIONAL))
   {
      Rational maxviol;
      Rational sumviol;

      os << "Violation (rational): \n";

      if(getBoundViolationRational(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolationRational(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolationRational(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolationRational(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
   else
   {
      R maxviol;
      R sumviol;

      os << "Violations (real)   : \n";

      if(getBoundViolation(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolation(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolation(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolation(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
}